

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations)

{
  undefined8 this_00;
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  string local_130;
  _Self local_110;
  _Self local_108;
  const_iterator pi;
  string *li;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string targetName;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *importedLocations_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  targetName.field_2._8_8_ = importedLocations;
  cmAlphaNum::cmAlphaNum(&local_80,&this->Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_d0,target);
  cmAlphaNum::cmAlphaNum(&local_b0,&local_d0);
  cmStrCat<>((string *)local_50,&local_80,&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar2 = std::operator<<(os,"list(APPEND _cmake_import_check_targets ");
  poVar2 = std::operator<<(poVar2,(string *)local_50);
  poVar2 = std::operator<<(poVar2," )\nlist(APPEND _cmake_import_check_files_for_");
  poVar2 = std::operator<<(poVar2,(string *)local_50);
  std::operator<<(poVar2," ");
  this_00 = targetName.field_2._8_8_;
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)targetName.field_2._8_8_);
  li = (string *)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&li), bVar1) {
    pi._M_node = (_Base_ptr)
                 std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
    local_108._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(properties,(key_type *)pi._M_node);
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(properties);
    bVar1 = std::operator!=(&local_108,&local_110);
    if (bVar1) {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_108);
      cmExportFileGeneratorEscape(&local_130,&ppVar3->second);
      poVar2 = std::operator<<(os,(string *)&local_130);
      std::operator<<(poVar2," ");
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(os,")\n\n");
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations)
{
  // Construct the imported target name.
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());

  os << "list(APPEND _cmake_import_check_targets " << targetName
     << " )\n"
        "list(APPEND _cmake_import_check_files_for_"
     << targetName << " ";

  for (std::string const& li : importedLocations) {
    auto pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}